

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O0

void ParseBoardInformation(EeePModuleInfo_t *info)

{
  byte bVar1;
  SmbiosHandle_t *base;
  char *pcVar2;
  char *str;
  void *strstart;
  EeePModuleInfo_t *info_local;
  
  base = info->Handles + (int)(uint)info->ContainedHndls;
  pcVar2 = GetSmbiosString(info->Manufacturer,base);
  if (pcVar2 != (char *)0x0) {
    printf("      Manufacturer: %s\n",pcVar2);
  }
  pcVar2 = GetSmbiosString(info->Product,base);
  if (pcVar2 != (char *)0x0) {
    printf("      Product: %s\n",pcVar2);
  }
  pcVar2 = GetSmbiosString(info->Version,base);
  if (pcVar2 != (char *)0x0) {
    printf("      Version: %s\n",pcVar2);
  }
  pcVar2 = GetSmbiosString(info->SerialNumber,base);
  if (pcVar2 != (char *)0x0) {
    printf("      Serial Number: %s\n",pcVar2);
  }
  pcVar2 = GetSmbiosString(info->AssetTag,base);
  if (pcVar2 != (char *)0x0) {
    printf("      Asset Tag: %s\n",pcVar2);
  }
  if (info->FeatureFlag != '\0') {
    printf("      Features: ");
    if ((info->FeatureFlag & 1) != 0) {
      printf("Motherboard ");
    }
    if ((info->FeatureFlag & 2) != 0) {
      printf("ReqDaughterBoard ");
    }
    if ((info->FeatureFlag & 4) != 0) {
      printf("Removable ");
    }
    if ((info->FeatureFlag & 8) != 0) {
      printf("Replaceable ");
    }
    if ((info->FeatureFlag & 0x10) != 0) {
      printf("HotSwapCapable ");
    }
    printf("\n");
  }
  pcVar2 = GetSmbiosString(info->Location,base);
  if (pcVar2 != (char *)0x0) {
    printf("      Location: %s\n",pcVar2);
  }
  bVar1 = info->BoardType;
  pcVar2 = FindBoardTypeText(info->BoardType);
  printf("      Board Type: %d (%s)\n",(ulong)bVar1,pcVar2);
  return;
}

Assistant:

void ParseBoardInformation(EeePModuleInfo_t *info)
{
    void *strstart = info->Handles + info->ContainedHndls;
    const char *str;
    if (str = GetSmbiosString(info->Manufacturer, strstart)) {
        printf("      Manufacturer: %s\n", str);
    }
    if (str = GetSmbiosString(info->Product, strstart)) {
        printf("      Product: %s\n", str);
    }
    if (str = GetSmbiosString(info->Version, strstart)) {
        printf("      Version: %s\n", str);
    }
    if (str = GetSmbiosString(info->SerialNumber, strstart)) {
        printf("      Serial Number: %s\n", str);
    }
    if (str = GetSmbiosString(info->AssetTag, strstart)) {
        printf("      Asset Tag: %s\n", str);
    }
    if (info->FeatureFlag) {
        printf("      Features: ");
        if (info->FeatureFlag & SMBIOS_IS_Motherboard) {
            printf("Motherboard ");
        }
        if (info->FeatureFlag & SMBIOS_REQ_DAUGHTER) {
            printf("ReqDaughterBoard ");
        }
        if (info->FeatureFlag & SMBIOS_REMOVABLE) {
            printf("Removable ");
        }
        if (info->FeatureFlag & SMBIOS_REPLACEABLE) {
            printf("Replaceable ");
        }
        if (info->FeatureFlag & SMBIOS_HOT_SWAP_CAP) {
            printf("HotSwapCapable ");
        }
        printf("\n");
    }
    if (str = GetSmbiosString(info->Location, strstart)) {
        printf("      Location: %s\n", str);
    }
    printf("      Board Type: %d (%s)\n", 
        info->BoardType, FindBoardTypeText(info->BoardType));
}